

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O3

void __thiscall CTxMemPoolEntry::UpdateModifiedFee(CTxMemPoolEntry *this,CAmount fee_diff)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0x7fffffffffffffff;
  lVar2 = this->nModFeesWithDescendants;
  if (lVar2 < 1) {
    if ((lVar2 == 0) || (lVar4 = -0x8000000000000000, -0x8000000000000000 - lVar2 <= fee_diff))
    goto LAB_00ac4a09;
  }
  else {
    lVar4 = 0x7fffffffffffffff;
    if (fee_diff <= 0x7fffffffffffffff - lVar2) {
LAB_00ac4a09:
      lVar4 = lVar2 + fee_diff;
    }
  }
  this->nModFeesWithDescendants = lVar4;
  lVar2 = this->nModFeesWithAncestors;
  if (lVar2 < 1) {
    if ((lVar2 == 0) || (lVar4 = -0x8000000000000000, -0x8000000000000000 - lVar2 <= fee_diff))
    goto LAB_00ac4a43;
  }
  else {
    lVar4 = 0x7fffffffffffffff;
    if (fee_diff <= 0x7fffffffffffffff - lVar2) {
LAB_00ac4a43:
      lVar4 = lVar2 + fee_diff;
    }
  }
  this->nModFeesWithAncestors = lVar4;
  lVar2 = this->m_modified_fee;
  if (lVar2 < 1) {
    if ((lVar2 != 0) && (lVar3 = -0x8000000000000000, fee_diff < -0x8000000000000000 - lVar2))
    goto LAB_00ac4a7f;
  }
  else if (0x7fffffffffffffff - lVar2 < fee_diff) goto LAB_00ac4a7f;
  lVar3 = lVar2 + fee_diff;
LAB_00ac4a7f:
  this->m_modified_fee = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void UpdateModifiedFee(CAmount fee_diff)
    {
        nModFeesWithDescendants = SaturatingAdd(nModFeesWithDescendants, fee_diff);
        nModFeesWithAncestors = SaturatingAdd(nModFeesWithAncestors, fee_diff);
        m_modified_fee = SaturatingAdd(m_modified_fee, fee_diff);
    }